

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test1DTileYfResourceArrays_Test::TestBody
          (CTestGen9Resource_Test1DTileYfResourceArrays_Test *this)

{
  uint32_t ExpectedValue;
  GMM_RESOURCE_FORMAT GVar1;
  uint32_t uVar2;
  int iVar3;
  long lVar4;
  GMM_RESOURCE_INFO *ResourceInfo;
  uint uVar5;
  GMM_MULTI_TILE_ARCH GVar6;
  undefined8 uStack_c8;
  GMM_RESCREATE_PARAMS gmmParams;
  
  gmmParams.pExistingSysMem = 0;
  gmmParams.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
  gmmParams.MaxLod = 0;
  gmmParams.ArraySize = 0;
  gmmParams.MaximumRenamingListLength = 0;
  gmmParams.NoGfxMemory = '\0';
  gmmParams._109_3_ = 0;
  gmmParams.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
  gmmParams.BaseAlignment = 0;
  gmmParams.OverridePitch = 0;
  gmmParams.RotateInfo = 0;
  gmmParams._84_4_ = 0;
  gmmParams.CpTag = 0;
  gmmParams._44_4_ = 0;
  gmmParams.field_6.BaseWidth64 = 0;
  gmmParams.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
  gmmParams.MSAA.SamplePattern = GMM_MSAA_DISABLED;
  gmmParams.MSAA.NumSamples = 0;
  gmmParams.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
  uStack_c8 = 1;
  gmmParams.ExistingSysMemSize = 0x100000000;
  gmmParams.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x2000000000;
  gmmParams.Type = RESOURCE_INVALID;
  gmmParams.Format = GMM_FORMAT_A4P4_UNORM_PALETTE1;
  gmmParams.BaseHeight = 0;
  gmmParams.Depth = 4;
  GVar6 = (GMM_MULTI_TILE_ARCH)&DAT_0018e0b0;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    GVar1 = CTestResource::SetResourceFormat((CTestResource *)this,(TEST_BPP)lVar4);
    uStack_c8 = CONCAT44(GVar1,(undefined4)uStack_c8);
    gmmParams.CpTag = 0x4000;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    ResourceInfo = (GMM_RESOURCE_INFO *)
                   (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                             (CommonULT::pGmmULTClientContext,&uStack_c8);
    ExpectedValue = *(uint32_t *)GVar6;
    uVar5 = ExpectedValue - 1;
    uVar5 = ~uVar5 & gmmParams.CpTag + uVar5;
    gmmParams.MultiTileArch = GVar6;
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,(TEST_BPP)lVar4);
    iVar3 = uVar2 * gmmParams.Depth;
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,ResourceInfo,ExpectedValue);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,ResourceInfo,(ulong)(iVar3 * uVar5 + 0xfff & 0xfffff000));
    GVar6 = gmmParams.MultiTileArch;
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,ResourceInfo,(ulong)uVar5);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo);
    GVar6 = (GMM_MULTI_TILE_ARCH)((long)GVar6 + 4);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test1DTileYfResourceArrays)
{
    const uint32_t TileSize[TEST_BPP_MAX] = {4096, 2048, 1024, 512, 256};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_1D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledYf   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    gmmParams.ArraySize            = 4;

    // Allocate more than 1 page
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 16 * 1024; // 16K is the max width you can specify
        gmmParams.BaseHeight  = 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        uint32_t AlignedWidth = GMM_ULT_ALIGN(gmmParams.BaseWidth64, TileSize[i]);
        uint32_t PitchInBytes = AlignedWidth * GetBppValue(bpp);
        uint32_t AlignedSize  = GMM_ULT_ALIGN(PitchInBytes * gmmParams.ArraySize, PAGE_SIZE);

        VerifyResourceHAlign<true>(ResourceInfo, TileSize[i]);
        VerifyResourceVAlign<false>(ResourceInfo, 0);       // N/A for 1D
        VerifyResourcePitch<false>(ResourceInfo, 0);        // N/A for 1D
        VerifyResourcePitchInTiles<false>(ResourceInfo, 0); // N/A for linear
        VerifyResourceSize<true>(ResourceInfo, AlignedSize);
        VerifyResourceQPitch<true>(ResourceInfo, AlignedWidth);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}